

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O2

int import_tls12_traffic_protection(ptls_t *tls,int is_enc,uint8_t **src,uint8_t *end)

{
  uint8_t *__dest;
  undefined1 *puVar1;
  ptls_aead_algorithm_t *ppVar2;
  size_t __n;
  uint8_t *puVar3;
  size_t sVar4;
  int iVar5;
  int iVar6;
  ptls_cipher_suite_t *ppVar7;
  ptls_aead_context_t *ppVar8;
  anon_struct_208_2_4e55c0bb_for_traffic_protection *__dest_00;
  
  __dest_00 = (anon_struct_208_2_4e55c0bb_for_traffic_protection *)&(tls->traffic_protection).enc;
  if (is_enc == 0) {
    __dest_00 = &tls->traffic_protection;
  }
  ppVar2 = tls->cipher_suite->aead;
  __n = ppVar2->key_size;
  iVar6 = 0x32;
  if (__n + 8 + (ppVar2->tls12).fixed_iv_size <= (ulong)((long)end - (long)*src)) {
    memcpy(__dest_00,*src,__n);
    puVar3 = *src;
    sVar4 = tls->cipher_suite->aead->key_size;
    *src = puVar3 + sVar4;
    __dest = (__dest_00->dec).secret + 0x20;
    memcpy(__dest,puVar3 + sVar4,(tls->cipher_suite->aead->tls12).fixed_iv_size);
    *src = *src + (tls->cipher_suite->aead->tls12).fixed_iv_size;
    iVar5 = ptls_decode64(&(__dest_00->dec).seq,src,end);
    if (iVar5 == 0) {
      ppVar7 = tls->cipher_suite;
      if ((is_enc != 0) && ((ppVar7->aead->tls12).record_iv_size != 0)) {
        iVar6 = ptls_decode64(&(__dest_00->dec).tls12_enc_record_iv,src,end);
        if (iVar6 != 0) {
          return 0x32;
        }
        ppVar7 = tls->cipher_suite;
      }
      puVar1 = &(__dest_00->dec).field_0x58;
      *puVar1 = *puVar1 | 1;
      ppVar8 = ptls_aead_new_direct(ppVar7->aead,is_enc,__dest_00,__dest);
      (__dest_00->dec).aead = ppVar8;
      iVar6 = 0x201;
      if (ppVar8 != (ptls_aead_context_t *)0x0) {
        iVar6 = 0;
      }
    }
  }
  return iVar6;
}

Assistant:

static int import_tls12_traffic_protection(ptls_t *tls, int is_enc, const uint8_t **src, const uint8_t *const end)
{
    struct st_ptls_traffic_protection_t *tp = is_enc ? &tls->traffic_protection.enc : &tls->traffic_protection.dec;

    if ((size_t)(end - *src) < tls->cipher_suite->aead->key_size + tls->cipher_suite->aead->tls12.fixed_iv_size + sizeof(uint64_t))
        return PTLS_ALERT_DECODE_ERROR;

    /* set properties */
    memcpy(tp->secret, *src, tls->cipher_suite->aead->key_size);
    *src += tls->cipher_suite->aead->key_size;
    memcpy(tp->secret + PTLS_MAX_SECRET_SIZE, *src, tls->cipher_suite->aead->tls12.fixed_iv_size);
    *src += tls->cipher_suite->aead->tls12.fixed_iv_size;
    if (ptls_decode64(&tp->seq, src, end) != 0)
        return PTLS_ALERT_DECODE_ERROR;
    if (is_enc && tls->cipher_suite->aead->tls12.record_iv_size != 0) {
        if (ptls_decode64(&tp->tls12_enc_record_iv, src, end) != 0)
            return PTLS_ALERT_DECODE_ERROR;
    }
    tp->tls12 = 1;

    /* instantiate aead */
    if ((tp->aead = ptls_aead_new_direct(tls->cipher_suite->aead, is_enc, tp->secret, tp->secret + PTLS_MAX_SECRET_SIZE)) == NULL)
        return PTLS_ERROR_NO_MEMORY;

    return 0;
}